

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix44<float> * Imath_3_2::Matrix44<float>::multiply(Matrix44<float> *a,Matrix44<float> *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float *in_RDX;
  float *in_RSI;
  Matrix44<float> *in_RDI;
  float c33;
  float c32;
  float c31;
  float c30;
  float a33;
  float a32;
  float a31;
  float a30;
  float c23;
  float c22;
  float c21;
  float c20;
  float a23;
  float a22;
  float a21;
  float a20;
  float c13;
  float c12;
  float c11;
  float c10;
  float a13;
  float a12;
  float a11;
  float a10;
  float c03;
  float c02;
  float c01;
  float c00;
  float a03;
  float a02;
  float a01;
  float a00;
  
  fVar1 = *in_RSI;
  fVar2 = in_RSI[1];
  fVar3 = in_RSI[2];
  fVar4 = in_RSI[3];
  fVar5 = in_RSI[4];
  fVar6 = in_RSI[5];
  fVar7 = in_RSI[6];
  fVar8 = in_RSI[7];
  fVar9 = in_RSI[8];
  fVar10 = in_RSI[9];
  fVar11 = in_RSI[10];
  fVar12 = in_RSI[0xb];
  fVar13 = in_RSI[0xc];
  fVar14 = in_RSI[0xd];
  fVar15 = in_RSI[0xe];
  fVar16 = in_RSI[0xf];
  Matrix44(in_RDI,fVar4 * in_RDX[0xc] + fVar3 * in_RDX[8] + fVar1 * *in_RDX + fVar2 * in_RDX[4],
           fVar4 * in_RDX[0xd] + fVar3 * in_RDX[9] + fVar1 * in_RDX[1] + fVar2 * in_RDX[5],
           fVar4 * in_RDX[0xe] + fVar3 * in_RDX[10] + fVar1 * in_RDX[2] + fVar2 * in_RDX[6],
           fVar4 * in_RDX[0xf] + fVar3 * in_RDX[0xb] + fVar1 * in_RDX[3] + fVar2 * in_RDX[7],
           fVar8 * in_RDX[0xc] + fVar7 * in_RDX[8] + fVar5 * *in_RDX + fVar6 * in_RDX[4],
           fVar8 * in_RDX[0xd] + fVar7 * in_RDX[9] + fVar5 * in_RDX[1] + fVar6 * in_RDX[5],
           fVar8 * in_RDX[0xe] + fVar7 * in_RDX[10] + fVar5 * in_RDX[2] + fVar6 * in_RDX[6],
           fVar8 * in_RDX[0xf] + fVar7 * in_RDX[0xb] + fVar5 * in_RDX[3] + fVar6 * in_RDX[7],
           fVar12 * in_RDX[0xc] + fVar11 * in_RDX[8] + fVar9 * *in_RDX + fVar10 * in_RDX[4],
           fVar12 * in_RDX[0xd] + fVar11 * in_RDX[9] + fVar9 * in_RDX[1] + fVar10 * in_RDX[5],
           fVar12 * in_RDX[0xe] + fVar11 * in_RDX[10] + fVar9 * in_RDX[2] + fVar10 * in_RDX[6],
           fVar12 * in_RDX[0xf] + fVar11 * in_RDX[0xb] + fVar9 * in_RDX[3] + fVar10 * in_RDX[7],
           fVar16 * in_RDX[0xc] + fVar15 * in_RDX[8] + fVar13 * *in_RDX + fVar14 * in_RDX[4],
           fVar16 * in_RDX[0xd] + fVar15 * in_RDX[9] + fVar13 * in_RDX[1] + fVar14 * in_RDX[5],
           fVar16 * in_RDX[0xe] + fVar15 * in_RDX[10] + fVar13 * in_RDX[2] + fVar14 * in_RDX[6],
           fVar16 * in_RDX[0xf] + fVar15 * in_RDX[0xb] + fVar13 * in_RDX[3] + fVar14 * in_RDX[7]);
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE inline IMATH_CONSTEXPR14 Matrix44<T>
Matrix44<T>::multiply (const Matrix44& a, const Matrix44& b) IMATH_NOEXCEPT
{
    const auto a00 = a.x[0][0];
    const auto a01 = a.x[0][1];
    const auto a02 = a.x[0][2];
    const auto a03 = a.x[0][3];

    const auto c00 =
        a00 * b.x[0][0] + a01 * b.x[1][0] + a02 * b.x[2][0] + a03 * b.x[3][0];
    const auto c01 =
        a00 * b.x[0][1] + a01 * b.x[1][1] + a02 * b.x[2][1] + a03 * b.x[3][1];
    const auto c02 =
        a00 * b.x[0][2] + a01 * b.x[1][2] + a02 * b.x[2][2] + a03 * b.x[3][2];
    const auto c03 =
        a00 * b.x[0][3] + a01 * b.x[1][3] + a02 * b.x[2][3] + a03 * b.x[3][3];

    const auto a10 = a.x[1][0];
    const auto a11 = a.x[1][1];
    const auto a12 = a.x[1][2];
    const auto a13 = a.x[1][3];

    const auto c10 =
        a10 * b.x[0][0] + a11 * b.x[1][0] + a12 * b.x[2][0] + a13 * b.x[3][0];
    const auto c11 =
        a10 * b.x[0][1] + a11 * b.x[1][1] + a12 * b.x[2][1] + a13 * b.x[3][1];
    const auto c12 =
        a10 * b.x[0][2] + a11 * b.x[1][2] + a12 * b.x[2][2] + a13 * b.x[3][2];
    const auto c13 =
        a10 * b.x[0][3] + a11 * b.x[1][3] + a12 * b.x[2][3] + a13 * b.x[3][3];

    const auto a20 = a.x[2][0];
    const auto a21 = a.x[2][1];
    const auto a22 = a.x[2][2];
    const auto a23 = a.x[2][3];

    const auto c20 =
        a20 * b.x[0][0] + a21 * b.x[1][0] + a22 * b.x[2][0] + a23 * b.x[3][0];
    const auto c21 =
        a20 * b.x[0][1] + a21 * b.x[1][1] + a22 * b.x[2][1] + a23 * b.x[3][1];
    const auto c22 =
        a20 * b.x[0][2] + a21 * b.x[1][2] + a22 * b.x[2][2] + a23 * b.x[3][2];
    const auto c23 =
        a20 * b.x[0][3] + a21 * b.x[1][3] + a22 * b.x[2][3] + a23 * b.x[3][3];

    const auto a30 = a.x[3][0];
    const auto a31 = a.x[3][1];
    const auto a32 = a.x[3][2];
    const auto a33 = a.x[3][3];

    const auto c30 =
        a30 * b.x[0][0] + a31 * b.x[1][0] + a32 * b.x[2][0] + a33 * b.x[3][0];
    const auto c31 =
        a30 * b.x[0][1] + a31 * b.x[1][1] + a32 * b.x[2][1] + a33 * b.x[3][1];
    const auto c32 =
        a30 * b.x[0][2] + a31 * b.x[1][2] + a32 * b.x[2][2] + a33 * b.x[3][2];
    const auto c33 =
        a30 * b.x[0][3] + a31 * b.x[1][3] + a32 * b.x[2][3] + a33 * b.x[3][3];
    return Matrix44 (
        c00,
        c01,
        c02,
        c03,
        c10,
        c11,
        c12,
        c13,
        c20,
        c21,
        c22,
        c23,
        c30,
        c31,
        c32,
        c33);
}